

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sequence_generation.cc
# Opt level: O0

bool __thiscall sptk::MSequenceGeneration::Get(MSequenceGeneration *this,double *output)

{
  int x28;
  int x0;
  double *output_local;
  MSequenceGeneration *this_local;
  bool local_1;
  
  if (output == (double *)0x0) {
    local_1 = false;
  }
  else {
    this->x_ = this->x_ >> 1;
    if ((this->x_ & 1U) == 0) {
      x0 = -1;
    }
    else {
      x0 = 1;
    }
    if ((this->x_ & 0x10000000U) == 0) {
      x28 = -1;
    }
    else {
      x28 = 1;
    }
    if (x0 + x28 == 0) {
      this->x_ = this->x_ | 0x80000000;
    }
    else {
      this->x_ = this->x_ & 0x7fffffff;
    }
    *output = (double)x0;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MSequenceGeneration::Get(double* output) {
  if (NULL == output) {
    return false;
  }

  // Generate m-sequence using X**31 + X**28 + 1.
  int x0, x28;

  x_ >>= 1;

  if (x_ & kB0) {
    x0 = 1;
  } else {
    x0 = -1;
  }

  if (x_ & kB28) {
    x28 = 1;
  } else {
    x28 = -1;
  }

  if (x0 + x28) {
    x_ &= kB31F;
  } else {
    x_ |= kB31;
  }

  *output = static_cast<double>(x0);

  return true;
}